

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_readwrite.c
# Opt level: O2

void canvas_saveto(_glist *x,_binbuf *b)

{
  int iVar1;
  t_gobj *x_00;
  int iVar2;
  uint uVar3;
  uint uVar4;
  t_symbol *ptVar5;
  t_symbol *ptVar6;
  _binbuf *x_01;
  t_atom *argv;
  t_symbol *ptVar7;
  _outconnect *p_Var8;
  t_gobj **pptVar9;
  t_linetraverser t;
  
  if ((x->gl_owner == (_glist *)0x0) || (x->gl_env != (_canvasenvironment *)0x0)) {
    ptVar5 = gensym("#N");
    ptVar6 = gensym("canvas");
    binbuf_addv(b,"ssiiiii;",ptVar5,ptVar6,(ulong)(uint)x->gl_screenx1,(ulong)(uint)x->gl_screeny1,
                (ulong)(uint)(x->gl_screenx2 - x->gl_screenx1),
                (ulong)(uint)(x->gl_screeny2 - x->gl_screeny1),(ulong)(uint)x->gl_font);
    canvas_savedeclarationsto(x,b);
  }
  else {
    x_01 = binbuf_new();
    binbuf_addbinbuf(x_01,(x->gl_obj).te_binbuf);
    iVar2 = binbuf_getnatom(x_01);
    argv = binbuf_getvec(x_01);
    ptVar5 = atom_getsymbolarg(1,iVar2,argv);
    binbuf_free(x_01);
    ptVar6 = gensym("#N");
    ptVar7 = gensym("canvas");
    uVar3 = x->gl_screenx1;
    uVar4 = x->gl_screeny1;
    iVar2 = x->gl_screenx2;
    iVar1 = x->gl_screeny2;
    if (ptVar5 == &s_) {
      ptVar5 = gensym("(subpatch)");
    }
    binbuf_addv(b,"ssiiiisi;",ptVar6,ptVar7,(ulong)uVar3,(ulong)uVar4,(ulong)(iVar2 - uVar3),
                (ulong)(iVar1 - uVar4),ptVar5,(ulong)(*(uint *)&x->field_0xe8 >> 1 & 1));
  }
  pptVar9 = &x->gl_list;
  while (x_00 = *pptVar9, x_00 != (t_gobj *)0x0) {
    gobj_save(x_00,b);
    pptVar9 = &x_00->g_next;
  }
  linetraverser_start(&t,x);
  while (p_Var8 = linetraverser_next(&t), p_Var8 != (_outconnect *)0x0) {
    uVar3 = canvas_getindex(x,&(t.tr_ob)->te_g);
    uVar4 = canvas_getindex(x,&(t.tr_ob2)->te_g);
    ptVar5 = gensym("#X");
    ptVar6 = gensym("connect");
    binbuf_addv(b,"ssiiii;",ptVar5,ptVar6,(ulong)uVar3,(ulong)(uint)t.tr_outno,(ulong)uVar4,
                (ulong)(uint)t.tr_inno);
  }
  if ((*(uint *)&x->field_0xe8 >> 8 & 1) == 0) {
    if ((((((x->gl_x1 == 0.0) && (!NAN(x->gl_x1))) && (x->gl_y1 == 0.0)) &&
         ((!NAN(x->gl_y1) && (x->gl_x2 == 1.0)))) &&
        ((!NAN(x->gl_x2) && ((x->gl_y2 == 1.0 && (!NAN(x->gl_y2))))))) &&
       ((x->gl_pixwidth == 0 && (x->gl_pixheight == 0)))) {
      return;
    }
  }
  else if ((~*(uint *)&x->field_0xe8 & 0x180) == 0) {
    ptVar5 = gensym("#X");
    ptVar6 = gensym("coords");
    binbuf_addv(b,"ssfffffffff;",(double)x->gl_x1,(double)x->gl_y1,(double)x->gl_x2,(double)x->gl_y2
                ,(double)x->gl_pixwidth,(double)x->gl_pixheight,
                *(undefined8 *)
                 (&DAT_001a8028 + (ulong)((*(uint *)&x->field_0xe8 >> 9 & 1) == 0) * 8),
                (double)x->gl_xmargin,ptVar5,ptVar6);
    return;
  }
  ptVar5 = gensym("#X");
  ptVar6 = gensym("coords");
  binbuf_addv(b,"ssfffffff;",(double)x->gl_x1,(double)x->gl_y1,(double)x->gl_x2,(double)x->gl_y2,
              (double)x->gl_pixwidth,(double)x->gl_pixheight,
              (double)(*(ushort *)&x->field_0xe8 >> 8 & 1),ptVar5,ptVar6);
  return;
}

Assistant:

static void canvas_saveto(t_canvas *x, t_binbuf *b)
{
    t_gobj *y;
    t_linetraverser t;
    t_outconnect *oc;

        /* subpatch */
    if (x->gl_owner && !x->gl_env)
    {
        /* have to go to original binbuf to find out how we were named. */
        t_binbuf *bz = binbuf_new();
        t_symbol *patchsym;
        binbuf_addbinbuf(bz, x->gl_obj.ob_binbuf);
        patchsym = atom_getsymbolarg(1, binbuf_getnatom(bz), binbuf_getvec(bz));
        binbuf_free(bz);
        binbuf_addv(b, "ssiiiisi;", gensym("#N"), gensym("canvas"),
            (int)(x->gl_screenx1),
            (int)(x->gl_screeny1),
            (int)(x->gl_screenx2 - x->gl_screenx1),
            (int)(x->gl_screeny2 - x->gl_screeny1),
            (patchsym != &s_ ? patchsym: gensym("(subpatch)")),
            x->gl_mapped);
    }
        /* root or abstraction */
    else
    {
        binbuf_addv(b, "ssiiiii;", gensym("#N"), gensym("canvas"),
            (int)(x->gl_screenx1),
            (int)(x->gl_screeny1),
            (int)(x->gl_screenx2 - x->gl_screenx1),
            (int)(x->gl_screeny2 - x->gl_screeny1),
                (int)x->gl_font);
        canvas_savedeclarationsto(x, b);
    }
    for (y = x->gl_list; y; y = y->g_next)
        gobj_save(y, b);

    linetraverser_start(&t, x);
    while ((oc = linetraverser_next(&t)))
    {
        int srcno = canvas_getindex(x, &t.tr_ob->ob_g);
        int sinkno = canvas_getindex(x, &t.tr_ob2->ob_g);
        binbuf_addv(b, "ssiiii;", gensym("#X"), gensym("connect"),
            srcno, t.tr_outno, sinkno, t.tr_inno);
    }
        /* unless everything is the default (as in ordinary subpatches)
        print out a "coords" message to set up the coordinate systems */
    if (x->gl_isgraph || x->gl_x1 || x->gl_y1 ||
        x->gl_x2 != 1 ||  x->gl_y2 != 1 || x->gl_pixwidth || x->gl_pixheight)
    {
        if (x->gl_isgraph && x->gl_goprect)
                /* if we have a graph-on-parent rectangle, we're new style.
                The format is arranged so
                that old versions of Pd can at least do something with it. */
            binbuf_addv(b, "ssfffffffff;", gensym("#X"), gensym("coords"),
                x->gl_x1, x->gl_y1,
                x->gl_x2, x->gl_y2,
                (t_float)x->gl_pixwidth, (t_float)x->gl_pixheight,
                (t_float)((x->gl_hidetext)?2.:1.),
                (t_float)x->gl_xmargin, (t_float)x->gl_ymargin);
                    /* otherwise write in 0.38-compatible form */
        else binbuf_addv(b, "ssfffffff;", gensym("#X"), gensym("coords"),
                x->gl_x1, x->gl_y1,
                x->gl_x2, x->gl_y2,
                (t_float)x->gl_pixwidth, (t_float)x->gl_pixheight,
                (t_float)x->gl_isgraph);
    }
}